

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeSIMDShuffle<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos)

{
  uchar uVar1;
  bool bVar2;
  uchar *puVar3;
  reference pvVar4;
  Ok local_8d [20];
  allocator<char> local_79;
  string local_78;
  Err local_58;
  _Optional_payload_base<unsigned_char> local_32;
  int local_30;
  undefined1 local_2c [2];
  optional<unsigned_char> lane;
  int i;
  array<unsigned_char,_16UL> lanes;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  local_30 = 0;
  while( true ) {
    if (0xf < local_30) {
      NullInstrParserCtx::makeSIMDShuffle
                ((NullInstrParserCtx *)ctx,pos,(array<unsigned_char,_16UL> *)local_2c);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,local_8d);
      return __return_storage_ptr__;
    }
    local_32 = (_Optional_payload_base<unsigned_char>)ParseInput::takeU8(&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_32);
    if (!bVar2) break;
    puVar3 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_32);
    uVar1 = *puVar3;
    pvVar4 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)local_2c,(long)local_30);
    *pvVar4 = uVar1;
    local_30 = local_30 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"expected lane index",&local_79);
  ParseInput::err(&local_58,&ctx->in,&local_78);
  Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_58);
  WATParser::Err::~Err(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeSIMDShuffle(Ctx& ctx, Index pos) {
  std::array<uint8_t, 16> lanes;
  for (int i = 0; i < 16; ++i) {
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    lanes[i] = *lane;
  }
  return ctx.makeSIMDShuffle(pos, lanes);
}